

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O2

string * __thiscall
duckdb::SQLLogicTestRunner::ReplaceKeywords
          (string *__return_storage_ptr__,SQLLogicTestRunner *this,string *input)

{
  string *psVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __node_base *p_Var3;
  allocator local_162;
  allocator local_161;
  string *local_160;
  string local_158;
  allocator local_138 [32];
  string *local_118;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  p_Var3 = &(this->environment_variables)._M_h._M_before_begin;
  local_160 = input;
  local_118 = __return_storage_ptr__;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::__cxx11::string::string(local_50,(string *)local_160);
    std::__cxx11::string::string(local_70,"${%s}",local_138);
    std::__cxx11::string::string((string *)&local_90,(string *)(p_Var3 + 1));
    StringUtil::Format<std::__cxx11::string>(&local_158,(StringUtil *)local_70,&local_90,in_RCX);
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 5);
    duckdb::StringUtil::Replace(local_110,local_50,&local_158);
    std::__cxx11::string::operator=((string *)local_160,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::string::string(local_b0,(string *)local_160);
  std::__cxx11::string::string((string *)&local_158,"__TEST_DIR__",&local_162);
  TestDirectoryPath_abi_cxx11_();
  duckdb::StringUtil::Replace(local_110,local_b0,&local_158,local_138);
  psVar1 = local_160;
  std::__cxx11::string::operator=((string *)local_160,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::string(local_d0,(string *)psVar1);
  std::__cxx11::string::string((string *)&local_158,"__WORKING_DIRECTORY__",&local_162);
  duckdb::FileSystem::GetWorkingDirectory_abi_cxx11_();
  duckdb::StringUtil::Replace(local_110,local_d0,&local_158,local_138);
  psVar1 = local_160;
  std::__cxx11::string::operator=((string *)local_160,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::string(local_f0,(string *)psVar1);
  std::__cxx11::string::string((string *)&local_158,"__BUILD_DIRECTORY__",&local_162);
  std::__cxx11::string::string
            ((string *)local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/build_O2",
             &local_161);
  duckdb::StringUtil::Replace(local_110,local_f0,&local_158,local_138);
  psVar1 = local_160;
  std::__cxx11::string::operator=((string *)local_160,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string(local_f0);
  psVar2 = local_118;
  std::__cxx11::string::string((string *)local_118,(string *)psVar1);
  return psVar2;
}

Assistant:

string SQLLogicTestRunner::ReplaceKeywords(string input) {
	// Replace environment variables in the SQL
	for (auto &it : environment_variables) {
		auto &name = it.first;
		auto &value = it.second;
		input = StringUtil::Replace(input, StringUtil::Format("${%s}", name), value);
	}
	input = StringUtil::Replace(input, "__TEST_DIR__", TestDirectoryPath());
	input = StringUtil::Replace(input, "__WORKING_DIRECTORY__", FileSystem::GetWorkingDirectory());
	input = StringUtil::Replace(input, "__BUILD_DIRECTORY__", DUCKDB_BUILD_DIRECTORY);
	return input;
}